

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapinfo.cpp
# Opt level: O2

vector<PBombInfo,_std::allocator<PBombInfo>_> * __thiscall
MapInfo::getBombs(vector<PBombInfo,_std::allocator<PBombInfo>_> *__return_storage_ptr__,
                 MapInfo *this)

{
  _List_node_base *p_Var1;
  value_type local_38;
  
  (__return_storage_ptr__->super__Vector_base<PBombInfo,_std::allocator<PBombInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PBombInfo,_std::allocator<PBombInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PBombInfo,_std::allocator<PBombInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = (_List_node_base *)&this->bombs;
  while (p_Var1 = (((_List_base<ItemInfo,_std::allocator<ItemInfo>_> *)&p_Var1->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var1 != (_List_node_base *)&this->bombs)
  {
    local_38.pos = (Vec2)p_Var1[1]._M_prev;
    local_38.velocity = (Vec2)p_Var1[2]._M_next;
    std::vector<PBombInfo,_std::allocator<PBombInfo>_>::push_back(__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<PBombInfo> MapInfo::getBombs()
{
    vector<PBombInfo> res;
    for (auto it = bombs.begin(); it != bombs.end(); ++it)
    {
        PBombInfo p;
        p.pos = it->pos;
        p.velocity = it->velocity;
        res.push_back(p);
    }
    return res;
}